

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

int yy_array_var(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  code *action;
  char *name;
  
  iVar4 = G->pos;
  iVar6 = G->thunkpos;
  iVar5 = 1;
  yyDo(G,yyPush,1,0,"yyPush");
  iVar3 = G->pos;
  iVar1 = G->thunkpos;
  yyText(G,G->begin,G->end);
  G->begin = G->pos;
  iVar2 = yymatchChar(G,0x40);
  if (iVar2 == 0) {
LAB_001075e5:
    G->pos = iVar3;
    G->thunkpos = iVar1;
    iVar3 = yymatchChar(G,0x40);
    if (iVar3 != 0) {
      iVar3 = yy_scalar(G);
      if (iVar3 != 0) {
        yyDo(G,yySet,-1,0,"yySet");
        iVar6 = G->begin;
        iVar4 = G->end;
        action = yy_2_array_var;
        name = "yy_2_array_var";
        goto LAB_00107639;
      }
    }
    G->pos = iVar4;
    G->thunkpos = iVar6;
    iVar5 = 0;
  }
  else {
    iVar2 = yy_varname(G);
    if (iVar2 == 0) goto LAB_001075e5;
    yyText(G,G->begin,G->end);
    iVar4 = G->pos;
    iVar6 = G->begin;
    G->end = iVar4;
    action = yy_1_array_var;
    name = "yy_1_array_var";
LAB_00107639:
    yyDo(G,action,iVar6,iVar4,name);
    yyDo(G,yyPop,1,0,"yyPop");
  }
  return iVar5;
}

Assistant:

YY_RULE(int) yy_array_var(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 1, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "array_var"));

  {  int yypos224= G->pos, yythunkpos224= G->thunkpos;  yyText(G, G->begin, G->end);  if (!(YY_BEGIN)) goto l225;  if (!yymatchChar(G, '@')) goto l225;
  if (!yy_varname(G))  goto l225;
  yyText(G, G->begin, G->end);  if (!(YY_END)) goto l225;  yyDo(G, yy_1_array_var, G->begin, G->end, "yy_1_array_var");
  goto l224;
  l225:;	  G->pos= yypos224; G->thunkpos= yythunkpos224;  if (!yymatchChar(G, '@')) goto l223;
  if (!yy_scalar(G))  goto l223;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_2_array_var, G->begin, G->end, "yy_2_array_var");

  }
  l224:;	  yyprintf((stderr, "  ok   array_var"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 1, 0, "yyPop");
  return 1;
  l223:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "array_var"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}